

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

void __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::PushLabel
          (BinaryReaderInterp *this,LabelKind kind,Offset offset,Offset fixup_offset,
          u32 handler_desc_index)

{
  value_type local_30;
  u32 local_20;
  Offset local_1c;
  u32 handler_desc_index_local;
  Offset fixup_offset_local;
  Offset offset_local;
  LabelKind kind_local;
  BinaryReaderInterp *this_local;
  
  local_30.kind = kind;
  local_30.offset = offset;
  local_30.fixup_offset = fixup_offset;
  local_30.handler_desc_index = handler_desc_index;
  local_20 = handler_desc_index;
  local_1c = fixup_offset;
  handler_desc_index_local = offset;
  fixup_offset_local = kind;
  _offset_local = this;
  std::
  vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ::push_back(&this->label_stack_,&local_30);
  return;
}

Assistant:

void BinaryReaderInterp::PushLabel(LabelKind kind,
                                   Istream::Offset offset,
                                   Istream::Offset fixup_offset,
                                   u32 handler_desc_index) {
  label_stack_.push_back(Label{kind, offset, fixup_offset, handler_desc_index});
}